

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::LoginMessage::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LoginMessage *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  LoginMessage *local_18;
  LoginMessage *this_local;
  
  local_18 = this;
  this_local = (LoginMessage *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Login(username=");
  poVar1 = std::operator<<(poVar1,(string *)&this->username_);
  poVar1 = std::operator<<(poVar1,", password=***");
  poVar1 = std::operator<<(poVar1,", alias=");
  poVar1 = std::operator<<(poVar1,(string *)&this->alias_);
  poVar1 = std::operator<<(poVar1,", application=");
  poVar1 = std::operator<<(poVar1,(string *)&this->application_);
  poVar1 = std::operator<<(poVar1,", version=");
  poVar1 = std::operator<<(poVar1,(string *)&this->application_version_);
  poVar1 = std::operator<<(poVar1,", api=");
  poVar1 = std::operator<<(poVar1,(string *)&this->api_);
  poVar1 = std::operator<<(poVar1,", api_version=");
  poVar1 = std::operator<<(poVar1,(string *)&this->api_version_);
  poVar1 = std::operator<<(poVar1,", product=");
  poVar1 = std::operator<<(poVar1,(string *)&this->product_);
  poVar1 = std::operator<<(poVar1,", product_serial_number=");
  poVar1 = std::operator<<(poVar1,(string *)&this->product_serial_number_);
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

const std::string LoginMessage::ToString()
{
    std::stringstream ss;
    ss << "Login(username=" << username_ << ", password=***" << ", alias=" << alias_ <<
       ", application=" << application_ << ", version=" << application_version_ <<
       ", api=" << api_ << ", api_version=" << api_version_ << ", product=" << product_ <<
       ", product_serial_number=" << product_serial_number_ << ")";
    return ss.str();
}